

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

void __thiscall CFFFileInput::~CFFFileInput(CFFFileInput *this)

{
  (this->super_Type2InterpreterImplementationAdapter).super_IType2InterpreterImplementation.
  _vptr_IType2InterpreterImplementation = (_func_int **)&PTR_ReadCharString_0036df10;
  FreeData(this);
  std::__cxx11::_List_base<IndexElement_*,_std::allocator<IndexElement_*>_>::_M_clear
            (&(this->mAdditionalGlyphs).
              super__List_base<IndexElement_*,_std::allocator<IndexElement_*>_>);
  std::
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_unsigned_short>,_std::_Select1st<std::pair<const_char_*const,_unsigned_short>_>,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::~_Rb_tree(&(this->mStringToSID)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::~_Rb_tree(&(this->mNameToIndex)._M_t);
  CFFPrimitiveReader::~CFFPrimitiveReader(&this->mPrimitivesReader);
  std::_Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::~_Vector_base
            (&(this->mEncodings).
              super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>);
  std::_Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>::~_Vector_base
            (&(this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_CharStrings_*>,_std::_Select1st<std::pair<const_long_long,_CharStrings_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_CharStrings_*>_>_>
  ::~_Rb_tree(&(this->mLocalSubrs)._M_t);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->mName).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

CFFFileInput::~CFFFileInput(void)
{
	FreeData();
}